

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O3

IRNode * __thiscall kratos::AssignStmt::get_child(AssignStmt *this,uint64_t index)

{
  Var *pVVar1;
  
  if (index == 1) {
    pVVar1 = this->right_;
  }
  else if (index == 0) {
    pVVar1 = this->left_;
  }
  else {
    pVVar1 = (Var *)0x0;
  }
  return &pVVar1->super_IRNode;
}

Assistant:

IRNode *AssignStmt::get_child(uint64_t index) {
    if (index == 0)
        return left_;
    else if (index == 1)
        return right_;
    else
        return nullptr;
}